

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_msg.c
# Opt level: O2

nng_err nni_http_req_parse(nng_http *conn,void *buf,size_t n,size_t *lenp)

{
  nng_err nVar1;
  nng_http_status nVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  nni_http_req *pnVar6;
  char *__s;
  size_t sVar7;
  size_t local_58;
  size_t cnt;
  size_t *local_48;
  nni_http_req *local_40;
  nng_http *local_38;
  
  local_48 = lenp;
  local_38 = conn;
  local_40 = nni_http_conn_req(conn);
  sVar7 = 0;
  pnVar6 = local_40;
LAB_00136ebd:
  do {
    __s = (char *)buf;
    nVar1 = http_scan_line(__s,n,&local_58);
    if (nVar1 != NNG_OK) {
      if (nVar1 != NNG_EAGAIN) {
LAB_00136fc2:
        (pnVar6->data).parsed = false;
      }
      *local_48 = sVar7;
      return nVar1;
    }
    sVar7 = sVar7 + local_58;
    if (*__s == '\0') goto LAB_00136fc2;
    buf = __s + local_58;
    n = n - local_58;
    if ((pnVar6->data).parsed != true) {
      (pnVar6->data).parsed = true;
      nVar2 = nni_http_get_status(local_38);
      if (nVar2 < NNG_HTTP_STATUS_BAD_REQUEST) {
        pcVar4 = strchr(__s,0x20);
        if (pcVar4 == (char *)0x0) {
LAB_00136f5c:
          nVar2 = NNG_HTTP_STATUS_BAD_REQUEST;
        }
        else {
          *pcVar4 = '\0';
          pcVar4 = pcVar4 + 1;
          pcVar5 = strchr(pcVar4,0x20);
          if (pcVar5 == (char *)0x0) goto LAB_00136f5c;
          *pcVar5 = '\0';
          cnt = (size_t)pcVar5;
          iVar3 = nni_url_canonify_uri(pcVar4);
          if (iVar3 != 0) goto LAB_00136f5c;
          iVar3 = nni_http_set_version(local_38,(char *)(cnt + 1));
          if (iVar3 == 0) {
            nni_http_set_method(local_38,__s);
            nni_http_set_uri(local_38,pcVar4,(char *)0x0);
            pnVar6 = local_40;
            goto LAB_00136ebd;
          }
          nVar2 = NNG_HTTP_STATUS_HTTP_VERSION_NOT_SUPP;
        }
        nni_http_set_status(local_38,nVar2,(char *)0x0);
        pnVar6 = local_40;
      }
      goto LAB_00136ebd;
    }
    http_parse_header(local_38,__s);
  } while( true );
}

Assistant:

nng_err
nni_http_req_parse(nng_http *conn, void *buf, size_t n, size_t *lenp)
{

	size_t        len = 0;
	size_t        cnt;
	int           rv  = 0;
	nni_http_req *req = nni_http_conn_req(conn);

	for (;;) {
		uint8_t *line;
		if ((rv = http_scan_line(buf, n, &cnt)) != 0) {
			break;
		}

		len += cnt;
		line = buf;
		buf  = line + cnt;
		n -= cnt;

		if (*line == '\0') {
			break;
		}

		if (req->data.parsed) {
			rv = http_parse_header(conn, line);
		} else {
			req->data.parsed = true;
			rv               = http_req_parse_line(conn, line);
		}
	}

	if (rv != NNG_EAGAIN) {
		req->data.parsed = false;
	}
	*lenp = len;
	return (rv);
}